

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createRealloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  RWNode *node;
  size_t sVar1;
  long lVar2;
  size_t size;
  GenericDefSite<dg::dda::RWNode> local_38;
  
  node = ReadWriteGraph::create(&this->graph,DYN_ALLOC);
  size = Offset::UNKNOWN;
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    lVar2 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    lVar2 = *(long *)(Inst + -8);
  }
  lVar2 = *(long *)(lVar2 + 0x20);
  sVar1 = Offset::UNKNOWN;
  if ((lVar2 != 0) && (*(char *)(lVar2 + 0x10) == '\x10')) {
    sVar1 = llvm::APInt::getLimitedValue((APInt *)(lVar2 + 0x18),0xffffffffffffffff);
  }
  if (sVar1 != 0) {
    (node->super_SubgraphNode<dg::dda::RWNode>).size = sVar1;
    size = sVar1;
  }
  local_38.offset.offset = 0;
  local_38.target = node;
  local_38.len.offset = size;
  std::
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
  ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
            ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
              *)&node->annotations,&local_38);
  if (this->buildUses == true) {
    addReallocUses(this,Inst,node,size);
  }
  return node;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createRealloc(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::DYN_ALLOC);

    uint64_t size = llvmutils::getConstantValue(Inst->getOperand(1));
    if (size == 0)
        size = Offset::UNKNOWN;
    else
        node.setSize(size);

    // realloc defines itself, since it copies the values
    // from previous memory
    node.addDef(&node, 0, size, false /* strong update */);

    if (buildUses) {
        // realloc copies the memory
        // NOTE: do not use mapPointers, it could lead to infinite
        // recursion as realloc may use itself and the 'node' is not
        // in the map yet
        addReallocUses(Inst, node, size);
    }
    return &node;
}